

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::EventLog(EventLog *this,ThreadContext *threadContext)

{
  Recycler *pRVar1;
  BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  TrackAllocData local_58;
  Recycler *local_30;
  Recycler *recycler;
  ThreadContext *local_18;
  ThreadContext *threadContext_local;
  EventLog *this_local;
  
  this->m_threadContext = threadContext;
  local_18 = threadContext;
  threadContext_local = (ThreadContext *)this;
  SlabAllocatorBase<8>::SlabAllocatorBase(&this->m_eventSlabAllocator,0x40000);
  SlabAllocatorBase<0>::SlabAllocatorBase(&this->m_miscSlabAllocator,0x8000);
  this->m_eventTimeCtr = 0;
  TTDTimer::TTDTimer(&this->m_timer);
  this->m_topLevelCallbackEventTime = -1;
  this->m_eventListVTable = (EventLogEntryVTableEntry *)0x0;
  TTEventList::TTEventList(&this->m_eventList,&this->m_eventSlabAllocator);
  TTEventList::Iterator::Iterator(&this->m_currentReplayEventIterator);
  TTModeStack::TTModeStack(&this->m_modeStack);
  this->m_currentMode = Invalid;
  this->m_autoTracesEnabled = true;
  SnapshotExtractor::SnapshotExtractor(&this->m_snapExtractor);
  this->m_elapsedExecutionTimeSinceSnapshot = 0.0;
  this->m_lastInflateSnapshotTime = -1;
  this->m_lastInflateMap = (InflateMap *)0x0;
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_propertyRecordPinSet);
  UnorderedArrayList<TTD::NSSnapType::SnapPropertyRecord,_2048UL>::UnorderedArrayList
            (&this->m_propertyRecordList,&this->m_miscSlabAllocator);
  this->m_sourceInfoCount = 0;
  UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
  UnorderedArrayList(&this->m_loadedTopLevelScripts,&this->m_miscSlabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::
  UnorderedArrayList(&this->m_newFunctionTopLevelScripts,&this->m_miscSlabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
  UnorderedArrayList(&this->m_evalTopLevelScripts,&this->m_miscSlabAllocator);
  InitializeEventListVTable(this);
  TTEventList::SetVTable(&this->m_eventList,this->m_eventListVTable);
  TTModeStack::Push(&this->m_modeStack,Invalid);
  pRVar1 = ThreadContext::GetRecycler(local_18);
  local_30 = pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::
              BaseHashSet<Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTEventLog.cpp"
             ,0x25a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  this_00 = (BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  JsUtil::
  BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(this_00,local_30,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_propertyRecordPinSet,this_00,local_30);
  return;
}

Assistant:

EventLog::EventLog(ThreadContext* threadContext)
        : m_threadContext(threadContext), m_eventSlabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_MID), m_miscSlabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_SMALL),
        m_eventTimeCtr(0), m_timer(), m_topLevelCallbackEventTime(-1),
        m_eventListVTable(nullptr), m_eventList(&this->m_eventSlabAllocator), m_currentReplayEventIterator(),
        m_modeStack(), m_currentMode(TTDMode::Invalid), m_autoTracesEnabled(true),
        m_snapExtractor(), m_elapsedExecutionTimeSinceSnapshot(0.0),
        m_lastInflateSnapshotTime(-1), m_lastInflateMap(nullptr), m_propertyRecordList(&this->m_miscSlabAllocator),
        m_sourceInfoCount(0), m_loadedTopLevelScripts(&this->m_miscSlabAllocator), m_newFunctionTopLevelScripts(&this->m_miscSlabAllocator), m_evalTopLevelScripts(&this->m_miscSlabAllocator)
    {
        this->InitializeEventListVTable();
        this->m_eventList.SetVTable(this->m_eventListVTable);

        this->m_modeStack.Push(TTDMode::Invalid);

        Recycler * recycler = threadContext->GetRecycler();
        this->m_propertyRecordPinSet.Root(RecyclerNew(recycler, PropertyRecordPinSet, recycler), recycler);
    }